

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckSightOrRange
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *self_00;
  VMValue *pVVar2;
  AActor *pAVar3;
  bool bVar4;
  double dVar5;
  bool local_5f;
  int u_2;
  int u_1;
  int u;
  int i;
  bool twodi;
  double range;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe06,
                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe06,
                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self_00 = (AActor *)(param->field_0).field_1.a;
  local_5f = true;
  if (self_00 != (AActor *)0x0) {
    local_5f = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_5f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe06,
                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe07,
                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type == '\x01') {
    dVar5 = param[1].field_0.f;
    if (numparam < 3) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xe08,
                      "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      iVar1 = (pVVar2->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xe08,
                      "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[2].field_0.i;
    }
    u._3_1_ = iVar1 != 0;
    dVar5 = dVar5 * dVar5;
    u_1 = 0;
    do {
      if (7 < u_1) {
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0xe1c,
                          "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,1);
          param_local._4_4_ = 1;
        }
        return param_local._4_4_;
      }
      if ((playeringame[u_1] & 1U) != 0) {
        bVar4 = DoCheckSightOrRange(self_00,(AActor *)(&players)[(long)u_1 * 0x54],dVar5,u._3_1_,
                                    true);
        if (bVar4) {
          if (numret < 1) {
            return 0;
          }
          if (ret != (VMReturn *)0x0) {
            VMReturn::SetInt(ret,0);
            return 1;
          }
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xe12,
                        "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        bVar4 = TObjPtr<AActor>::operator!=
                          ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)u_1 * 0x2a0),(AActor *)0x0);
        if ((bVar4) &&
           (pAVar3 = TObjPtr<AActor>::operator->
                               ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)u_1 * 0x2a0)),
           pAVar3->player == (player_t *)0x0)) {
          pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(&DAT_01ae7238 + (long)u_1 * 0x2a0))
          ;
          bVar4 = DoCheckSightOrRange(self_00,pAVar3,dVar5,u._3_1_,true);
          if (bVar4) {
            if (numret < 1) {
              return 0;
            }
            if (ret != (VMReturn *)0x0) {
              VMReturn::SetInt(ret,0);
              return 1;
            }
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0xe18,
                          "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
      }
      u_1 = u_1 + 1;
    } while( true );
  }
  __assert_fail("param[paramnum].Type == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe07,
                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSightOrRange)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(range);
	PARAM_BOOL_DEF(twodi);

	range *= range;
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			// Always check from each player.
			if (DoCheckSightOrRange(self, players[i].mo, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
			// If a player is viewing from a non-player, check that too.
			if (players[i].camera != NULL && players[i].camera->player == NULL &&
				DoCheckSightOrRange(self, players[i].camera, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
		}
	}
	ACTION_RETURN_BOOL(true);
}